

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unshuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  char *local_40;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  int *status_local;
  LONGLONG length_local;
  char *heap_local;
  
  __src = malloc(length << 3);
  local_40 = heap + length * 8;
  heapptr = (char *)((long)__src + length * 8 + -1);
  for (ptr = (char *)0x0; local_40 = local_40 + -1, (long)ptr < length; ptr = ptr + 1) {
    *heapptr = *local_40;
    heapptr[-1] = local_40[-length];
    heapptr[-2] = local_40[length * -2];
    heapptr[-3] = local_40[length * -3];
    heapptr[-4] = local_40[length * -4];
    heapptr[-5] = local_40[length * -5];
    heapptr[-6] = local_40[length * -6];
    heapptr[-7] = local_40[length * -7];
    heapptr = heapptr + -8;
  }
  memcpy(heap,__src,length << 3);
  free(__src);
  return *status;
}

Assistant:

static int fits_unshuffle_8bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 8-byte integers or doubles */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 8));
    heapptr = heap + (8 * length) - 1;
    cptr = ptr + (8 * length)  -1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       *cptr = *(heapptr - (4 * length));
       cptr--;
       *cptr = *(heapptr - (5 * length));
       cptr--;
       *cptr = *(heapptr - (6 * length));
       cptr--;
       *cptr = *(heapptr - (7 * length));
       cptr--;
       heapptr--;
    }
       
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
    return(*status);
}